

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O1

void h265e_dpb_free_unsed(H265eDpb *dpb,EncCpbStatus *cpb)

{
  MPP_RET MVar1;
  H265eDpbFrm *pHVar2;
  long lVar3;
  EncFrmStatus *in_RDX;
  EncFrmStatus *extraout_RDX;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_free_unsed");
    in_RDX = extraout_RDX;
  }
  if (((ulong)cpb->curr & 0x40) != 0) {
    pHVar2 = h265e_find_cpb_frame(dpb->frame_list,(int)cpb + 8,in_RDX);
    if (pHVar2 != (H265eDpbFrm *)0x0) {
      if (((byte)h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","free curr unreference buf poc %d",(char *)0x0,
                   (ulong)(uint)pHVar2->slice->poc);
      }
      pHVar2->is_long_term = 0;
      pHVar2->used_by_cur = 0;
      *(undefined1 *)&pHVar2->field_7 = 0;
      pHVar2->slice->is_referenced = 0;
    }
  }
  lVar6 = 0;
  do {
    if (*(char *)&dpb->frame_list[lVar6].field_7 != '\0') {
      if (((byte)h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_dpb","enter\n","h265e_check_frame_cpb");
      }
      pHVar2 = dpb->frame_list + lVar6;
      iVar4 = -1;
      lVar3 = 0xb;
      do {
        iVar5 = iVar4;
        if ((cpb->init[lVar3 + -3].val ^ (pHVar2->status).val) >> 0x30 == 0) {
          iVar5 = 0;
        }
        if ((cpb->init[lVar3 + -3].val & 1) == 0) {
          iVar5 = iVar4;
        }
        iVar4 = iVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1b);
      if (((byte)h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_dpb","leave\n","h265e_check_frame_cpb");
      }
      if (iVar4 != 0) {
        MVar1 = h265e_pskip_ref_check(dpb,cpb,pHVar2);
        if (MVar1 == MPP_OK) {
          if (((byte)h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","cpb final unreference buf poc %d",(char *)0x0,
                       (ulong)(uint)pHVar2->slice->poc);
          }
          pHVar2->is_long_term = 0;
          pHVar2->used_by_cur = 0;
          *(undefined1 *)&pHVar2->field_7 = 0;
          pHVar2->slice->is_referenced = 0;
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x11);
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_free_unsed");
  return;
}

Assistant:

void h265e_dpb_free_unsed(H265eDpb *dpb, EncCpbStatus *cpb)
{
    RK_S32 i = 0;

    h265e_dbg_func("enter\n");

    if (cpb->curr.is_non_ref) {
        H265eDpbFrm *frm = h265e_find_cpb_frame(dpb->frame_list, MAX_REFS, &cpb->curr);
        if (frm) {
            h265e_dbg_dpb("free curr unreference buf poc %d", frm->slice->poc);
            frm->is_long_term = 0;
            frm->used_by_cur = 0;
            frm->dpb_used = 0;
            frm->slice->is_referenced = 0;
        }
    }

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dpb->frame_list); i++) {
        H265eDpbFrm *frm = &dpb->frame_list[i];
        if (!frm->dpb_used)
            continue;
        if (h265e_check_frame_cpb(frm, MAX_REFS, &cpb->final[0])) {
            if (!h265e_pskip_ref_check(dpb, cpb, frm)) {
                h265e_dbg_dpb("cpb final unreference buf poc %d", frm->slice->poc);
                frm->is_long_term = 0;
                frm->used_by_cur = 0;
                frm->dpb_used = 0;
                frm->slice->is_referenced = 0;
            }
        }
    }

    h265e_dbg_func("leave\n");
}